

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

string * __thiscall
lan::db::write_array_bit_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bit *bits)

{
  db_bit *bit;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bit = bits->lin;
  if ((bits->key)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  }
  else {
    std::operator+(&local_50,&bits->key,"=");
  }
  std::operator+(__return_storage_ptr__,&local_50,"a:[");
  std::__cxx11::string::~string((string *)&local_50);
  while (bit != (db_bit *)0x0) {
    write_bit_abi_cxx11_(&local_50,this,bit,true);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    bit = bit->nex;
    if (bit != (db_bit *)0x0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_array_bit(db_bit * bits){
            db_bit * buffer = bits->lin;
            std::string bits_str = ((bits->key.length()) ? bits->key + "=" : "") + "a:[";
            while(buffer){
                bits_str += write_bit(buffer, true);
                buffer = buffer->nex;
                if(buffer)bits_str += (' ');
            } bits_str += "]";
            return bits_str;
        }